

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::_::DebugComparison<kj::Maybe<kj::ArrayPtr<char_const>>&,kj::ArrayPtr<char_const>>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<kj::Maybe<kj::ArrayPtr<const_char>_>_&,_kj::ArrayPtr<const_char>_> *params
          )

{
  kj *this_00;
  DebugComparison<kj::Maybe<kj::ArrayPtr<const_char>_>_&,_kj::ArrayPtr<const_char>_> *value;
  String local_30;
  kj *local_18;
  DebugComparison<kj::Maybe<kj::ArrayPtr<const_char>_>_&,_kj::ArrayPtr<const_char>_> *params_local;
  
  local_18 = this;
  params_local = (DebugComparison<kj::Maybe<kj::ArrayPtr<const_char>_>_&,_kj::ArrayPtr<const_char>_>
                  *)__return_storage_ptr__;
  this_00 = (kj *)fwd<kj::_::DebugComparison<kj::Maybe<kj::ArrayPtr<char_const>>&,kj::ArrayPtr<char_const>>&>
                            ((DebugComparison<kj::Maybe<kj::ArrayPtr<const_char>_>_&,_kj::ArrayPtr<const_char>_>
                              *)this);
  toCharSequence<kj::_::DebugComparison<kj::Maybe<kj::ArrayPtr<char_const>>&,kj::ArrayPtr<char_const>>&>
            (&local_30,this_00,value);
  _::concat(__return_storage_ptr__,&local_30);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}